

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::results
          (quadratic_cost_type<double> *this,bit_array *x,double cost_constant)

{
  uint uVar1;
  objective_function *poVar2;
  pointer poVar3;
  pointer poVar4;
  unsigned_long *puVar5;
  index *piVar6;
  ulong uVar7;
  uint uVar8;
  
  poVar2 = this->obj;
  poVar3 = (poVar2->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(poVar2->elements).
                super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3;
  if ((uVar7 & 0xffffffff0) != 0) {
    piVar6 = &poVar3->variable_index;
    uVar7 = uVar7 >> 4 & 0xffffffff;
    do {
      uVar1 = *piVar6;
      uVar8 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar8 = uVar1;
      }
      if (((x->super_bit_array_impl).m_data._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar8 >> 6] >>
           ((ulong)uVar1 & 0x3f) & 1) != 0) {
        cost_constant = cost_constant + ((objective_function_element *)(piVar6 + -2))->factor;
      }
      piVar6 = piVar6 + 4;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  poVar4 = (poVar2->qelements).
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(poVar2->qelements).
                super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)poVar4;
  if ((uVar7 & 0xffffffff0) != 0) {
    puVar5 = (x->super_bit_array_impl).m_data._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    piVar6 = &poVar4->variable_index_b;
    uVar7 = uVar7 >> 4 & 0xffffffff;
    do {
      uVar1 = piVar6[-1];
      uVar8 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar8 = uVar1;
      }
      if ((puVar5[(int)uVar8 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        uVar1 = *piVar6;
        uVar8 = uVar1 + 0x3f;
        if (-1 < (int)uVar1) {
          uVar8 = uVar1;
        }
        if ((puVar5[(int)uVar8 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
          cost_constant = cost_constant + ((objective_quadratic_element *)(piVar6 + -3))->factor;
        }
      }
      piVar6 = piVar6 + 4;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return cost_constant;
}

Assistant:

double results(const bit_array& x, double cost_constant) const noexcept
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i)
            if (x[obj.elements[i].variable_index])
                cost_constant += obj.elements[i].factor;

        for (int i = 0, e = length(obj.qelements); i != e; ++i)
            if (x[obj.qelements[i].variable_index_a] &&
                x[obj.qelements[i].variable_index_b])
                cost_constant += obj.qelements[i].factor;

        return cost_constant;
    }